

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall
pugi::xml_node::first_element_by_path(xml_node *this,char_t *path_,char_t delimiter)

{
  char *pcVar1;
  char cVar2;
  char_t *pcVar3;
  xml_node *this_00;
  long lVar4;
  long lVar5;
  char_t *pcVar6;
  char_t *path__00;
  xml_node_struct *p;
  xml_node found;
  xml_node local_50;
  int local_44;
  xml_node local_40;
  xml_node local_38;
  
  local_40 = (xml_node)this->_root;
  if ((local_40._root != (xml_node_struct *)0x0) && (*path_ != '\0')) {
    if (*path_ == delimiter) {
      xml_node(&local_50,
               (xml_node_struct *)
               (*(long *)((long)local_40._root - ((local_40._root)->header >> 8)) + -0x40));
      path_ = path_ + 1;
      local_40._root = local_50._root;
    }
    pcVar6 = path_ + -3;
    do {
      pcVar3 = pcVar6;
      cVar2 = pcVar3[3];
      pcVar6 = pcVar3 + 1;
    } while (cVar2 == delimiter);
    lVar5 = 0;
    do {
      lVar4 = lVar5;
      lVar5 = lVar4 + 1;
      if (pcVar3[lVar4 + 3] == '\0') break;
    } while (pcVar3[lVar4 + 3] != delimiter);
    if (lVar5 != 1) {
      pcVar6 = pcVar3 + 1 + lVar5;
      do {
        path__00 = pcVar6 + 1;
        pcVar1 = pcVar6 + 1;
        pcVar6 = path__00;
      } while (*pcVar1 == delimiter);
      if (lVar5 == 2 && cVar2 == '.') {
        this_00 = &local_40;
      }
      else {
        if (((cVar2 != '.') || (lVar5 != 3)) || (pcVar3[4] != '.')) {
          p = (local_40._root)->first_child;
          if (p != (xml_node_struct *)0x0) {
            local_44 = (int)delimiter;
            do {
              pcVar6 = p->name;
              if (pcVar6 != (char_t *)0x0) {
                lVar5 = 0;
                do {
                  if (pcVar6[lVar5] != pcVar3[lVar5 + 3]) goto LAB_0018a2bc;
                  lVar5 = lVar5 + 1;
                } while (lVar4 != lVar5);
                if (pcVar6[lVar4] == '\0') {
                  xml_node(&local_50,p);
                  local_38 = first_element_by_path(&local_50,path__00,(char_t)local_44);
                  if (local_38._root != (xml_node_struct *)0x0) {
                    return (xml_node)local_38._root;
                  }
                }
              }
LAB_0018a2bc:
              p = p->next_sibling;
            } while (p != (xml_node_struct *)0x0);
          }
          xml_node(&local_38);
          return (xml_node)local_38._root;
        }
        if (local_40._root == (xml_node_struct *)0x0) {
          xml_node(&local_50);
        }
        else {
          xml_node(&local_50,(local_40._root)->parent);
        }
        this_00 = &local_50;
      }
      local_40 = first_element_by_path(this_00,path__00,delimiter);
    }
  }
  return (xml_node)local_40._root;
}

Assistant:

PUGI__FN xml_node xml_node::first_element_by_path(const char_t* path_, char_t delimiter) const
	{
		xml_node found = *this; // Current search context.

		if (!_root || !path_[0]) return found;

		if (path_[0] == delimiter)
		{
			// Absolute path; e.g. '/foo/bar'
			found = found.root();
			++path_;
		}

		const char_t* path_segment = path_;

		while (*path_segment == delimiter) ++path_segment;

		const char_t* path_segment_end = path_segment;

		while (*path_segment_end && *path_segment_end != delimiter) ++path_segment_end;

		if (path_segment == path_segment_end) return found;

		const char_t* next_segment = path_segment_end;

		while (*next_segment == delimiter) ++next_segment;

		if (*path_segment == '.' && path_segment + 1 == path_segment_end)
			return found.first_element_by_path(next_segment, delimiter);
		else if (*path_segment == '.' && *(path_segment+1) == '.' && path_segment + 2 == path_segment_end)
			return found.parent().first_element_by_path(next_segment, delimiter);
		else
		{
			for (xml_node_struct* j = found._root->first_child; j; j = j->next_sibling)
			{
				if (j->name && impl::strequalrange(j->name, path_segment, static_cast<size_t>(path_segment_end - path_segment)))
				{
					xml_node subsearch = xml_node(j).first_element_by_path(next_segment, delimiter);

					if (subsearch) return subsearch;
				}
			}

			return xml_node();
		}
	}